

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

StatisticObject __thiscall Clasp::ProblemStats::at(ProblemStats *this,char *key)

{
  int iVar1;
  char *in_RSI;
  uint *in_stack_ffffffffffffffd8;
  uint64 local_8;
  
  iVar1 = strcmp(in_RSI,"vars");
  if (iVar1 == 0) {
    local_8 = (uint64)StatisticObject::value<unsigned_int>(in_stack_ffffffffffffffd8);
  }
  else {
    iVar1 = strcmp(in_RSI,"vars_eliminated");
    if (iVar1 == 0) {
      local_8 = (uint64)StatisticObject::value<unsigned_int>(in_stack_ffffffffffffffd8);
    }
    else {
      iVar1 = strcmp(in_RSI,"vars_frozen");
      if (iVar1 == 0) {
        local_8 = (uint64)StatisticObject::value<unsigned_int>(in_stack_ffffffffffffffd8);
      }
      else {
        iVar1 = strcmp(in_RSI,"constraints");
        if (iVar1 == 0) {
          local_8 = (uint64)StatisticObject::value<unsigned_int>(in_stack_ffffffffffffffd8);
        }
        else {
          iVar1 = strcmp(in_RSI,"constraints_binary");
          if (iVar1 == 0) {
            local_8 = (uint64)StatisticObject::value<unsigned_int>(in_stack_ffffffffffffffd8);
          }
          else {
            iVar1 = strcmp(in_RSI,"constraints_ternary");
            if (iVar1 == 0) {
              local_8 = (uint64)StatisticObject::value<unsigned_int>(in_stack_ffffffffffffffd8);
            }
            else {
              iVar1 = strcmp(in_RSI,"acyc_edges");
              if (iVar1 == 0) {
                local_8 = (uint64)StatisticObject::value<unsigned_int>(in_stack_ffffffffffffffd8);
              }
              else {
                iVar1 = strcmp(in_RSI,"complexity");
                if (iVar1 != 0) {
                  Potassco::fail(0x22,"StatisticObject Clasp::ProblemStats::at(const char *) const",
                                 0x39,"false",(char *)0x0);
                }
                local_8 = (uint64)StatisticObject::value<unsigned_int>(in_stack_ffffffffffffffd8);
              }
            }
          }
        }
      }
    }
  }
  return (StatisticObject)local_8;
}

Assistant:

StatisticObject ProblemStats::at(const char* key) const {
#define VALUE(X) StatisticObject::value(&X)
#define APPLY(x, y) if (std::strcmp(key, #x) == 0) return y;
	PS_STATS(APPLY)
	POTASSCO_CHECK(false, ERANGE);
#undef VALUE
#undef APPLY
}